

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

char sx_os_getch(void)

{
  int iVar1;
  undefined1 local_80 [7];
  char ch;
  termios new_term;
  termios old_term;
  
  tcgetattr(0,(termios *)&new_term.c_ispeed);
  memcpy(local_80,&new_term.c_ispeed,0x3c);
  new_term.c_oflag = new_term.c_oflag & 2;
  tcsetattr(0,0,(termios *)local_80);
  iVar1 = getchar();
  tcsetattr(0,0,(termios *)&new_term.c_ispeed);
  return (char)iVar1;
}

Assistant:

char sx_os_getch(void)
{
#if SX_PLATFORM_WINDOWS
    return (char)(getchar() & 0xff);
#elif SX_PLATFORM_POSIX
    struct termios old_term;
    struct termios new_term;
    tcgetattr(0, &old_term);
    new_term = old_term;
    new_term.c_lflag &= ICANON;
    new_term.c_lflag &= ~ECHO;
    tcsetattr(0, TCSANOW, &new_term);
    char ch = getchar();
    tcsetattr(0, TCSANOW, &old_term);
    return ch;
#endif
}